

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

void ClientObituary(AActor *self,AActor *inflictor,AActor *attacker,int dmgflags)

{
  player_t *ppVar1;
  AWeapon *pAVar2;
  FName FVar3;
  undefined8 *puVar4;
  AActor *pAVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  undefined8 *puVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char cVar12;
  undefined8 *puVar13;
  int gender;
  char *name;
  AActor *pAVar14;
  char gendermessage [1024];
  char local_438 [1032];
  PClass *pPVar11;
  
  ppVar1 = self->player;
  if (ppVar1 == (player_t *)0x0) {
    return;
  }
  if (ppVar1->mo != (APlayerPawn *)self) {
    return;
  }
  if (!show_obituaries.Value) {
    return;
  }
  puVar4 = (undefined8 *)
           ((long)&((ppVar1->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                   Nodes)->Next +
           (ulong)(((ppVar1->userinfo).
                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.
                    Size - 1 & 0x209) * 0x18));
  do {
    puVar10 = puVar4;
    puVar4 = (undefined8 *)*puVar10;
  } while (*(int *)(puVar10 + 1) != 0x209);
  if (((inflictor != (AActor *)0x0) && (inflictor->player != (player_t *)0x0)) &&
     (inflictor->player->mo != (APlayerPawn *)inflictor)) {
    MeansOfDeath.Index = 0;
  }
  FVar3.Index = MeansOfDeath.Index;
  gender = *(int *)(puVar10[2] + 0x28);
  if ((attacker == (AActor *)0x0) || (attacker->player != (player_t *)0x0)) {
    if (MeansOfDeath.Index != 0xc1) {
      bVar6 = AnnounceKill(attacker,self);
      if (bVar6) {
        return;
      }
      goto LAB_003fcc74;
    }
    bVar6 = AnnounceTelefrag(attacker,self);
    if (bVar6) {
      return;
    }
    name = (char *)0x0;
  }
  else {
LAB_003fcc74:
    name = (char *)0x0;
    switch(FVar3.Index) {
    case 0xbf:
      name = "OB_WATER";
      break;
    case 0xc0:
      name = "OB_SLIME";
      break;
    case 0xc1:
      break;
    case 0xc2:
      name = "OB_FALLING";
      break;
    case 0xc3:
      name = "OB_SUICIDE";
      break;
    case 0xc4:
      name = "OB_EXIT";
      break;
    default:
      if (FVar3.Index == 0x90) {
        name = "OB_CRUSH";
      }
      else if ((FVar3.Index == 0xa4) && (name = (char *)0x0, attacker == (AActor *)0x0)) {
        name = "OB_LAVA";
      }
    }
  }
  if (((inflictor == (AActor *)0x0) || (inflictor->player == (player_t *)0x0)) ||
     (inflictor->player->mo == (APlayerPawn *)inflictor)) {
    if (name != (char *)0x0) goto LAB_003fcd13;
    name = (char *)0x0;
    pcVar9 = (char *)0x0;
  }
  else {
    name = "OB_VOODOO";
LAB_003fcd13:
    pcVar9 = FStringTable::operator()(&GStrings,name);
  }
  pAVar14 = self;
  if ((attacker != (AActor *)0x0) && (pcVar9 == (char *)0x0)) {
    if (attacker == self) {
      pcVar9 = "OB_KILLEDSELF";
LAB_003fcd51:
      pcVar9 = FStringTable::operator()(&GStrings,pcVar9);
      goto LAB_003fcd5d;
    }
    if (attacker->player != (player_t *)0x0) {
LAB_003fcd46:
      pcVar9 = (char *)0x0;
      goto LAB_003fcd5d;
    }
    if (FVar3.Index == 0xc1) {
      pcVar9 = "OB_MONTELEFRAG";
      goto LAB_003fcd51;
    }
    pAVar5 = self;
    if (FVar3.Index == 0x89) {
      pPVar11 = (attacker->super_DThinker).super_DObject.Class;
      if (pPVar11 == (PClass *)0x0) {
        iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
        pPVar11 = (PClass *)CONCAT44(extraout_var_01,iVar8);
        (attacker->super_DThinker).super_DObject.Class = pPVar11;
      }
      pcVar9 = *(char **)&pPVar11[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.MemberOnly;
      if (*(int *)(pcVar9 + -0xc) == 0) goto LAB_003fcf42;
    }
    else {
      pPVar11 = (attacker->super_DThinker).super_DObject.Class;
      if (pPVar11 == (PClass *)0x0) {
        iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
        pPVar11 = (PClass *)CONCAT44(extraout_var_02,iVar8);
        (attacker->super_DThinker).super_DObject.Class = pPVar11;
      }
LAB_003fcf42:
      pcVar9 = *(char **)&pPVar11[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                          super_PCompoundType.super_PType.Symbols.Symbols.Size;
      if (*(int *)(pcVar9 + -0xc) == 0) goto LAB_003fcd46;
    }
    goto LAB_003fcf86;
  }
LAB_003fcd5d:
  pAVar5 = self;
  if ((attacker == (AActor *)0x0) || (pcVar9 != (char *)0x0)) {
LAB_003fce19:
    self = pAVar5;
    pAVar5 = self;
    if (pcVar9 == (char *)0x0) goto LAB_003fcfa4;
LAB_003fcf86:
    self = pAVar5;
    cVar12 = *pcVar9;
    if (cVar12 != '$') goto LAB_003fcfc2;
    pcVar9 = FStringTable::operator[](&GStrings,pcVar9 + 1);
    if (pcVar9 == (char *)0x0) goto LAB_003fcfa4;
  }
  else {
    if (attacker->player != (player_t *)0x0) {
      if ((self->player != attacker->player) && (bVar6 = AActor::IsTeammate(self,attacker), bVar6))
      {
        puVar4 = (undefined8 *)
                 ((long)&((attacker->player->userinfo).
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                         .Nodes)->Next +
                 (ulong)(((attacker->player->userinfo).
                          super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                          .Size - 1 & 0x209) * 0x18));
        do {
          puVar10 = puVar4;
          puVar4 = (undefined8 *)*puVar10;
        } while (*(int *)(puVar10 + 1) != 0x209);
        gender = *(int *)(puVar10[2] + 0x28);
        uVar7 = FRandom::GenRand32(&pr_obituary);
        mysnprintf(local_438,0x400,"OB_FRIENDLY%c",(ulong)((uVar7 & 3) + 0x31));
        pcVar9 = FStringTable::operator()(&GStrings,local_438);
        pAVar5 = attacker;
        pAVar14 = attacker;
        goto LAB_003fce19;
      }
      if ((FVar3.Index != 0xc1) ||
         (pcVar9 = FStringTable::operator()(&GStrings,"OB_MPTELEFRAG"), pAVar5 = attacker,
         pcVar9 == (char *)0x0)) {
        if (inflictor != (AActor *)0x0) {
          pPVar11 = (inflictor->super_DThinker).super_DObject.Class;
          if (pPVar11 == (PClass *)0x0) {
            iVar8 = (**(inflictor->super_DThinker).super_DObject._vptr_DObject)(inflictor);
            pPVar11 = (PClass *)CONCAT44(extraout_var,iVar8);
            (inflictor->super_DThinker).super_DObject.Class = pPVar11;
          }
          pcVar9 = *(char **)&pPVar11[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                              super_PCompoundType.super_PType.Symbols.Symbols.Size;
          pAVar5 = attacker;
          if (*(int *)(pcVar9 + -0xc) != 0) goto LAB_003fcf86;
        }
        if (((dmgflags & 0x20U) != 0) &&
           (pAVar2 = attacker->player->ReadyWeapon, pAVar2 != (AWeapon *)0x0)) {
          pPVar11 = (pAVar2->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                    super_DObject.Class;
          if (pPVar11 == (PClass *)0x0) {
            iVar8 = (**(pAVar2->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject._vptr_DObject)(pAVar2);
            pPVar11 = (PClass *)CONCAT44(extraout_var_00,iVar8);
            (pAVar2->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject.Class = pPVar11;
          }
          pcVar9 = *(char **)&pPVar11[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                              super_PCompoundType.super_PType.Symbols.Symbols.Size;
          pAVar5 = attacker;
          if (pcVar9 != (char *)0x0) goto LAB_003fcf86;
        }
        if (FVar3.Index == 200) {
          name = "OB_MPBFG_SPLASH";
LAB_003fcf6a:
          pcVar9 = FStringTable::operator()(&GStrings,name);
          pAVar5 = attacker;
          if (pcVar9 != (char *)0x0) goto LAB_003fcf86;
        }
        else {
          if (FVar3.Index == 0xc5) {
            name = "OB_RAILGUN";
            goto LAB_003fcf6a;
          }
          if (name != (char *)0x0) goto LAB_003fcf6a;
        }
        pPVar11 = (attacker->super_DThinker).super_DObject.Class;
        if (pPVar11 == (PClass *)0x0) {
          iVar8 = (**(attacker->super_DThinker).super_DObject._vptr_DObject)(attacker);
          pPVar11 = (PClass *)CONCAT44(extraout_var_03,iVar8);
          (attacker->super_DThinker).super_DObject.Class = pPVar11;
        }
        pcVar9 = *(char **)&pPVar11[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.Symbols.Symbols.Size;
        pAVar5 = attacker;
        goto LAB_003fce19;
      }
      goto LAB_003fcf86;
    }
LAB_003fcfa4:
    pcVar9 = FStringTable::operator()(&GStrings,"OB_DEFAULT");
    if (pcVar9 == (char *)0x0) {
      return;
    }
  }
  cVar12 = *pcVar9;
LAB_003fcfc2:
  if (cVar12 != '\0') {
    puVar4 = (undefined8 *)
             ((long)&((pAVar14->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((pAVar14->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    do {
      puVar10 = puVar4;
      puVar4 = (undefined8 *)*puVar10;
    } while (*(int *)(puVar10 + 1) != 0x1ea);
    puVar4 = (undefined8 *)
             ((long)&((self->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((self->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1ea) * 0x18));
    do {
      puVar13 = puVar4;
      puVar4 = (undefined8 *)*puVar13;
    } while (*(int *)(puVar13 + 1) != 0x1ea);
    SexMessage(pcVar9,local_438,gender,*(char **)(puVar10[2] + 0x28),*(char **)(puVar13[2] + 0x28));
    Printf(1,"%s\n",local_438);
  }
  return;
}

Assistant:

void ClientObituary (AActor *self, AActor *inflictor, AActor *attacker, int dmgflags)
{
	FName mod;
	const char *message;
	const char *messagename;
	char gendermessage[1024];
	int  gender;

	// No obituaries for non-players, voodoo dolls or when not wanted
	if (self->player == NULL || self->player->mo != self || !show_obituaries)
		return;

	gender = self->player->userinfo.GetGender();

	// Treat voodoo dolls as unknown deaths
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
		MeansOfDeath = NAME_None;

	mod = MeansOfDeath;
	message = NULL;
	messagename = NULL;

	if (attacker == NULL || attacker->player != NULL)
	{
		if (mod == NAME_Telefrag)
		{
			if (AnnounceTelefrag (attacker, self))
				return;
		}
		else
		{
			if (AnnounceKill (attacker, self))
				return;
		}
	}

	switch (mod)
	{
	case NAME_Suicide:		messagename = "OB_SUICIDE";		break;
	case NAME_Falling:		messagename = "OB_FALLING";		break;
	case NAME_Crush:		messagename = "OB_CRUSH";		break;
	case NAME_Exit:			messagename = "OB_EXIT";		break;
	case NAME_Drowning:		messagename = "OB_WATER";		break;
	case NAME_Slime:		messagename = "OB_SLIME";		break;
	case NAME_Fire:			if (attacker == NULL) messagename = "OB_LAVA";		break;
	}

	// Check for being killed by a voodoo doll.
	if (inflictor && inflictor->player && inflictor->player->mo != inflictor)
	{
		messagename = "OB_VOODOO";
	}

	if (messagename != NULL)
		message = GStrings(messagename);

	if (attacker != NULL && message == NULL)
	{
		if (attacker == self)
		{
			message = GStrings("OB_KILLEDSELF");
		}
		else if (attacker->player == NULL)
		{
			if (mod == NAME_Telefrag)
			{
				message = GStrings("OB_MONTELEFRAG");
			}
			else if (mod == NAME_Melee && attacker->GetClass()->HitObituary.IsNotEmpty())
			{
				message = attacker->GetClass()->HitObituary;
			}
			else if (attacker->GetClass()->Obituary.IsNotEmpty())
			{
				message = attacker->GetClass()->Obituary;
			}
		}
	}

	if (message == NULL && attacker != NULL && attacker->player != NULL)
	{
		if (self->player != attacker->player && self->IsTeammate(attacker))
		{
			self = attacker;
			gender = self->player->userinfo.GetGender();
			mysnprintf (gendermessage, countof(gendermessage), "OB_FRIENDLY%c", '1' + (pr_obituary() & 3));
			message = GStrings(gendermessage);
		}
		else
		{
			if (mod == NAME_Telefrag) message = GStrings("OB_MPTELEFRAG");
			if (message == NULL)
			{
				if (inflictor != NULL && inflictor->GetClass()->Obituary.IsNotEmpty())
				{
					message = inflictor->GetClass()->Obituary;
				}
				if (message == NULL && (dmgflags & DMG_PLAYERATTACK) && attacker->player->ReadyWeapon != NULL)
				{
					message = attacker->player->ReadyWeapon->GetClass()->Obituary;
				}
				if (message == NULL)
				{
					switch (mod)
					{
					case NAME_BFGSplash:	messagename = "OB_MPBFG_SPLASH";	break;
					case NAME_Railgun:		messagename = "OB_RAILGUN";			break;
					}
					if (messagename != NULL)
						message = GStrings(messagename);
				}
				if (message == NULL)
				{
					message = attacker->GetClass()->Obituary;
				}
			}
		}
	}
	else attacker = self;	// for the message creation

	if (message != NULL && message[0] == '$') 
	{
		message = GStrings[message+1];
	}

	if (message == NULL)
	{
		message = GStrings("OB_DEFAULT");
	}

	// [CK] Don't display empty strings
	if (message == NULL || strlen(message) <= 0)
		return;
		
	SexMessage (message, gendermessage, gender,
		self->player->userinfo.GetName(), attacker->player->userinfo.GetName());
	Printf (PRINT_MEDIUM, "%s\n", gendermessage);
}